

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O3

bool __thiscall Game::play(Game *this)

{
  bool bVar1;
  ulong in_RAX;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  char *pcVar5;
  bool quit;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"--= Coloring Game by Uriya Harpeness =--",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Try to fill the whole board (",0x1d);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(uint)(this->m_board).m_height)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"X",1);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)(this->m_board).m_width);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") in ",5);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," moves or less.",0xf);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Controls are: \'r\' - red, \'g\' - green, \'b\' - blue, \'y\' - yellow, \'c\' - cyan, \'m\' - magenta, \'u\' - undo, \'s\' - change base, \'q\' ESC DEL BACKSPACE - quit."
             ,0x97);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  uStack_28 = uStack_28 & 0xffffffffffffff;
  bVar1 = Board::solved(&this->m_board);
  if (bVar1) {
LAB_0010550d:
    Board::print(&this->m_board,this->m_moves);
    bVar1 = Board::solved(&this->m_board);
    if (bVar1) {
      poVar3 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"--= Congrats you win =--",0x18);
      bVar1 = true;
      goto LAB_0010555b;
    }
    pcVar5 = "--= Boo you lose =--";
    lVar4 = 0x14;
    poVar3 = (ostream *)&std::cout;
  }
  else {
    do {
      if ((this->m_moves == 0) || ((uStack_28 & 0x100000000000000) != 0)) goto LAB_001054ce;
      turn(this,(bool *)((long)&uStack_28 + 7));
      bVar1 = Board::solved(&this->m_board);
    } while (!bVar1);
LAB_001054ce:
    if ((uStack_28._7_1_ & 1) == 0) goto LAB_0010550d;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    poVar3 = (ostream *)std::ostream::flush();
    pcVar5 = "--= Rookie move... =--";
    lVar4 = 0x16;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,lVar4);
  bVar1 = false;
LAB_0010555b:
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return bVar1;
}

Assistant:

bool Game::play() {
    // Display title.
    cout << "--= Coloring Game by Uriya Harpeness =--" << endl << endl;
    cout << "Try to fill the whole board (" << (int) m_board.get_height() << "X" << (int) m_board.get_width() << ") in "
         << m_moves << " moves or less." << endl;
    cout << "Controls are: 'r' - red, 'g' - green, 'b' - blue, 'y' - yellow, 'c' - cyan, 'm' - magenta, 'u' - undo"
            ", 's' - change base, 'q' ESC DEL BACKSPACE - quit." << endl;

    bool quit = false;
    // Run the game.
    while (!m_board.solved() && (m_moves > 0) && !quit) {
        turn(quit);
    }

    // Disqualification.
    if (quit) {
        cout << endl << "--= Rookie move... =--" << endl;
        return false;
    }

    m_board.print(m_moves);

    if (m_board.solved()) {
        // Victory.
        cout << "--= Congrats you win =--" << endl;
        return true;
    } else {
        // Defeat.
        cout << "--= Boo you lose =--" << endl;
        return false;
    }
}